

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O0

bool asio::detail::reactive_socket_recv_op_base<asio::mutable_buffers_1>::do_perform
               (reactor_op *base)

{
  bool bVar1;
  bool result;
  buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1> bufs;
  reactive_socket_recv_op_base<asio::mutable_buffers_1> *o;
  size_t *in_stack_00000050;
  mutable_buffers_1 *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1> local_28;
  
  buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::buffer_sequence_adapter
            ((buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1> *)
             CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
            );
  buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::buffers(&local_28);
  buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::count(&local_28);
  bVar1 = socket_ops::non_blocking_recv
                    ((socket_type)base,(buf *)o,bufs.total_buffer_size_,bufs.buffer_.iov_len._4_4_,
                     bufs.buffer_.iov_len._3_1_,(error_code *)bufs.buffer_.iov_base,
                     in_stack_00000050);
  return bVar1;
}

Assistant:

static bool do_perform(reactor_op* base)
  {
    reactive_socket_recv_op_base* o(
        static_cast<reactive_socket_recv_op_base*>(base));

    buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence> bufs(o->buffers_);

    bool result = socket_ops::non_blocking_recv(o->socket_,
        bufs.buffers(), bufs.count(), o->flags_,
        (o->state_ & socket_ops::stream_oriented) != 0,
        o->ec_, o->bytes_transferred_);

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_recv",
          o->ec_, o->bytes_transferred_));

    return result;
  }